

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O3

_Bool opensshcert_check_cert
                (ssh_key *key,_Bool host,ptrlen principal,uint64_t time,ca_options *opts,
                BinarySink *error)

{
  _func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *p_Var1;
  _func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *p_Var2;
  _func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *p_Var3;
  _func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *p_Var4;
  ptrlen pVar5;
  char cVar6;
  _Bool _Var7;
  strbuf *buf_o;
  ssh_keyalg *psVar8;
  ssh_key *psVar9;
  char *pcVar10;
  _func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *p_Var11;
  char *pcVar12;
  _func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *p_Var13;
  BinarySink *pBVar14;
  ptrlen pVar15;
  ptrlen blob;
  ptrlen pVar16;
  BinarySource src [1];
  BinarySource local_68;
  ssh_keyalg *local_38;
  
  local_38 = (ssh_keyalg *)time;
  buf_o = strbuf_new();
  psVar8 = key[-3].vt;
  p_Var1 = (key[-2].vt)->new_priv;
  p_Var2 = (key[-2].vt)->new_priv_openssh;
  pVar5.ptr = psVar8->new_priv;
  pVar5.len = (size_t)psVar8->new_priv_openssh;
  pVar16.ptr = psVar8->new_priv;
  pVar16.len = (size_t)psVar8->new_priv_openssh;
  psVar8 = pubkey_blob_to_alg(pVar16);
  if ((psVar8 == (ssh_keyalg *)0x0) ||
     (psVar9 = (*psVar8->new_pub)(psVar8,pVar5), psVar9 == (ssh_key *)0x0)) {
    pBVar14 = error->binarysink_;
    pcVar10 = "Certificate\'s signing key is invalid";
LAB_00156a75:
    _Var7 = false;
    BinarySink_put_fmt(pBVar14,pcVar10);
    goto LAB_00156a82;
  }
  if (psVar9->vt->is_certificate == true) {
    pBVar14 = error->binarysink_;
    pcVar10 = 
    "Certificate is signed with a certified key (forbidden by OpenSSH certificate specification)";
LAB_00156a4c:
    _Var7 = false;
    BinarySink_put_fmt(pBVar14,pcVar10);
    goto LAB_00156a57;
  }
  (*psVar9->vt->freekey)(psVar9);
  p_Var3 = (key[-3].vt)->new_priv;
  p_Var13 = p_Var1;
  if (p_Var1 == (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *)0x0) {
    p_Var13 = p_Var3;
  }
  p_Var4 = (key[-3].vt)->new_priv_openssh;
  p_Var11 = p_Var2;
  if (p_Var1 == (_func_ssh_key_ptr_ssh_keyalg_ptr_ptrlen_ptrlen *)0x0) {
    p_Var11 = p_Var4;
  }
  blob.len = (size_t)p_Var11;
  blob.ptr = p_Var13;
  psVar8 = pubkey_blob_to_alg(blob);
  if ((psVar8 == (ssh_keyalg *)0x0) ||
     (pVar15.len = (size_t)p_Var4, pVar15.ptr = p_Var3, psVar9 = (*psVar8->new_pub)(psVar8,pVar15),
     psVar9 == (ssh_key *)0x0)) {
    pBVar14 = error->binarysink_;
    pcVar10 = "Certificate\'s signing key does not match signature type";
    goto LAB_00156a75;
  }
  psVar8 = psVar9->vt;
  if (psVar8 == &ssh_rsa) {
    cVar6 = opts->permit_rsa_sha1;
joined_r0x00156b2c:
    if (cVar6 != '\0') goto LAB_00156b32;
LAB_00156bbf:
    pBVar14 = error->binarysink_;
    pcVar10 = psVar8->ssh_id;
    pcVar12 = "Certificate signature uses \'%s\' signature type (forbidden by user configuration)";
LAB_00156d4b:
    _Var7 = false;
    BinarySink_put_fmt(pBVar14,pcVar12,pcVar10);
  }
  else {
    if (psVar8 == &ssh_rsa_sha256) {
      cVar6 = opts->permit_rsa_sha256;
      goto joined_r0x00156b2c;
    }
    if ((psVar8 == &ssh_rsa_sha512) && (opts->permit_rsa_sha512 == false)) goto LAB_00156bbf;
LAB_00156b32:
    opensshcert_signature_preimage((opensshcert_key *)(key + -0xd),buf_o->binarysink_);
    cVar6 = (*psVar9->vt->verify)(psVar9,p_Var1,p_Var2,buf_o->u,buf_o->len);
    psVar8 = local_38;
    if (cVar6 == '\0') {
      pBVar14 = error->binarysink_;
      pcVar10 = "Certificate\'s signature is invalid";
LAB_00156ba7:
      _Var7 = false;
      BinarySink_put_fmt(pBVar14,pcVar10);
    }
    else {
      if (*(int *)&key[-0xb].vt != host + 1) {
        BinarySink_put_fmt(error->binarysink_,"Certificate type is ");
        if (*(int *)&key[-0xb].vt == 1) {
          pcVar10 = "user";
LAB_00156d14:
          BinarySink_put_fmt(error->binarysink_,pcVar10);
        }
        else {
          if (*(int *)&key[-0xb].vt == 2) {
            pcVar10 = "host";
            goto LAB_00156d14;
          }
          BinarySink_put_fmt(error->binarysink_,"unknown value %u");
        }
        pBVar14 = error->binarysink_;
        pcVar10 = "user";
        if (host) {
          pcVar10 = "host";
        }
        pcVar12 = "; expected %s";
        goto LAB_00156d4b;
      }
      if (local_38 < key[-8].vt) {
        pBVar14 = error->binarysink_;
        pcVar10 = "Certificate is not valid until ";
      }
      else {
        if (local_38 < key[-7].vt) {
          local_68.len = (size_t)(key[-9].vt)->new_priv_openssh;
          if ((_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)local_68.len !=
              (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
            local_68.data = (key[-9].vt)->new_priv;
            local_68.pos = 0;
            local_68.err = BSE_NO_ERROR;
            local_68.binarysource_ = &local_68;
LAB_00156c57:
            if ((local_68.binarysource_)->len == (local_68.binarysource_)->pos) {
              pcVar10 = "username";
              if (host) {
                pcVar10 = "hostname";
              }
              BinarySink_put_fmt(error->binarysink_,"Certificate\'s %s list [");
              local_68.data = (key[-9].vt)->new_priv;
              local_68.len = (size_t)(key[-9].vt)->new_priv_openssh;
              local_68.pos = 0;
              local_68.err = BSE_NO_ERROR;
              local_68.binarysource_ = &local_68;
              if ((_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)local_68.len !=
                  (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
                pcVar12 = "";
                do {
                  pVar16 = BinarySource_get_string(local_68.binarysource_);
                  BinarySink_put_fmt(error->binarysink_,"%s\"",pcVar12);
                  BinarySink_put_c_string_literal(error->binarysink_,pVar16);
                  BinarySink_put_fmt(error->binarysink_,"\"");
                  pcVar12 = ", ";
                } while ((local_68.binarysource_)->len != (local_68.binarysource_)->pos);
              }
              BinarySink_put_fmt(error->binarysink_,"] does not contain expected %s \"",pcVar10);
              pBVar14 = error->binarysink_;
              goto LAB_00156eb7;
            }
            pVar16 = BinarySource_get_string(local_68.binarysource_);
            if ((local_68.binarysource_)->err == BSE_NO_ERROR) goto code_r0x00156c7e;
            pBVar14 = error->binarysink_;
            pcVar10 = "Certificate\'s valid principals list is incorrectly formatted";
            goto LAB_00156ba7;
          }
LAB_00156c95:
          local_68.data = (key[-6].vt)->new_priv;
          local_68.len = (size_t)(key[-6].vt)->new_priv_openssh;
          local_68.binarysource_ = &local_68;
          local_68.pos = 0;
          local_68.err = BSE_NO_ERROR;
          if ((_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)local_68.len !=
              (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
            principal = BinarySource_get_string(&local_68);
            pVar16 = BinarySource_get_string(local_68.binarysource_);
            if ((local_68.binarysource_)->err == BSE_NO_ERROR) {
              BinarySink_put_fmt(error->binarysink_,
                                 "Certificate specifies an unsupported critical option \"",
                                 pVar16.len);
              pBVar14 = error->binarysink_;
LAB_00156eb7:
              BinarySink_put_c_string_literal(pBVar14,principal);
              pBVar14 = error->binarysink_;
              pcVar10 = "\"";
            }
            else {
              pBVar14 = error->binarysink_;
              pcVar10 = "Certificate\'s critical options list is incorrectly formatted";
            }
            goto LAB_00156a4c;
          }
          _Var7 = true;
          goto LAB_00156a57;
        }
        pBVar14 = error->binarysink_;
        pcVar10 = "Certificate expired at ";
      }
      _Var7 = false;
      BinarySink_put_fmt(pBVar14,pcVar10);
      opensshcert_time_to_iso8601(error->binarysink_->binarysink_,(uint64_t)psVar8);
    }
  }
LAB_00156a57:
  (*psVar9->vt->freekey)(psVar9);
LAB_00156a82:
  strbuf_free(buf_o);
  return _Var7;
code_r0x00156c7e:
  _Var7 = ptrlen_eq_ptrlen(pVar16,principal);
  if (_Var7) goto LAB_00156c95;
  goto LAB_00156c57;
}

Assistant:

static bool opensshcert_check_cert(
    ssh_key *key, bool host, ptrlen principal, uint64_t time,
    const ca_options *opts, BinarySink *error)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    bool result = false;
    ssh_key *ca_key = NULL;
    strbuf *preimage = strbuf_new();
    BinarySource src[1];

    ptrlen signature = ptrlen_from_strbuf(ck->signature);

    /*
     * The OpenSSH certificate spec is one-layer only: it explicitly
     * forbids using a certified key in turn as the CA.
     *
     * If it did not, then we'd also have to recursively verify
     * everything up the CA chain until we reached the ultimate root,
     * and then make sure _that_ was something we trusted. (Not to
     * mention that there'd probably be an additional SSH_CERT_TYPE_CA
     * or some such, and certificate options saying what kinds of
     * certificate a CA was trusted to sign for, and ...)
     */
    ca_key = opensshcert_ca_pub_key(ck, make_ptrlen(NULL, 0), NULL);
    if (!ca_key) {
        put_fmt(error, "Certificate's signing key is invalid");
        goto out;
    }
    if (ssh_key_alg(ca_key)->is_certificate) {
        put_fmt(error, "Certificate is signed with a certified key "
                "(forbidden by OpenSSH certificate specification)");
        goto out;
    }

    /*
     * Now re-instantiate the key in a way that matches the signature
     * (i.e. so that if the key is an RSA one we get the right subtype
     * of RSA).
     */
    ssh_key_free(ca_key);
    ca_key = opensshcert_ca_pub_key(ck, signature, NULL);
    if (!ca_key) {
        put_fmt(error, "Certificate's signing key does not match "
                "signature type");
        goto out;
    }

    /* Check which signature algorithm is actually in use, because
     * that might be a reason to reject the certificate (e.g. ssh-rsa
     * when we wanted rsa-sha2-*). */
    const ssh_keyalg *sig_alg = ssh_key_alg(ca_key);
    if ((sig_alg == &ssh_rsa && !opts->permit_rsa_sha1) ||
        (sig_alg == &ssh_rsa_sha256 && !opts->permit_rsa_sha256) ||
        (sig_alg == &ssh_rsa_sha512 && !opts->permit_rsa_sha512)) {
        put_fmt(error, "Certificate signature uses '%s' signature type "
                "(forbidden by user configuration)", sig_alg->ssh_id);
        goto out;
    }

    opensshcert_signature_preimage(ck, BinarySink_UPCAST(preimage));

    if (!ssh_key_verify(ca_key, signature, ptrlen_from_strbuf(preimage))) {
        put_fmt(error, "Certificate's signature is invalid");
        goto out;
    }

    uint32_t expected_type = host ? SSH_CERT_TYPE_HOST : SSH_CERT_TYPE_USER;
    if (ck->type != expected_type) {
        put_fmt(error, "Certificate type is ");
        switch (ck->type) {
          case SSH_CERT_TYPE_HOST:
            put_fmt(error, "host");
            break;
          case SSH_CERT_TYPE_USER:
            put_fmt(error, "user");
            break;
          default:
            put_fmt(error, "unknown value %" PRIu32, ck->type);
            break;
        }
        put_fmt(error, "; expected %s", host ? "host" : "user");
        goto out;
    }

    /*
     * Check the time bounds on the certificate.
     */
    if (time < ck->valid_after) {
        put_fmt(error, "Certificate is not valid until ");
        opensshcert_time_to_iso8601(BinarySink_UPCAST(error), time);
        goto out;
    }
    if (time >= ck->valid_before) {
        put_fmt(error, "Certificate expired at ");
        opensshcert_time_to_iso8601(BinarySink_UPCAST(error), time);
        goto out;
    }

    /*
     * Check that this certificate is for the right thing.
     *
     * If valid_principals is a zero-length string then this is
     * specified to be a carte-blanche certificate valid for any
     * principal (at least, provided you trust the CA that issued it).
     */
    if (ck->valid_principals->len != 0) {
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->valid_principals));

        while (get_avail(src)) {
            ptrlen valid_principal = get_string(src);
            if (get_err(src)) {
                put_fmt(error, "Certificate's valid principals list is "
                        "incorrectly formatted");
                goto out;
            }
            if (ptrlen_eq_ptrlen(valid_principal, principal))
                goto principal_ok;
        }

        /*
         * No valid principal matched. Now go through the list a
         * second time writing the cert contents into the error
         * message, so that the user can see at a glance what went
         * wrong.
         *
         * (If you've typed the wrong spelling of the host name, you
         * really need to see "This cert is for 'foo.example.com' and
         * I was trying to match it against 'foo'", rather than just
         * "Computer says no".)
         */
        put_fmt(error, "Certificate's %s list [",
                host ? "hostname" : "username");
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->valid_principals));
        const char *sep = "";
        while (get_avail(src)) {
            ptrlen valid_principal = get_string(src);
            put_fmt(error, "%s\"", sep);
            put_c_string_literal(error, valid_principal);
            put_fmt(error, "\"");
            sep = ", ";
        }
        put_fmt(error, "] does not contain expected %s \"",
                host ? "hostname" : "username");
        put_c_string_literal(error, principal);
        put_fmt(error, "\"");
        goto out;
      principal_ok:;
    }

    /*
     * Check for critical options.
     */
    {
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->critical_options));

        while (get_avail(src)) {
            ptrlen option = get_string(src);
            ptrlen data = get_string(src);
            if (get_err(src)) {
                put_fmt(error, "Certificate's critical options list is "
                        "incorrectly formatted");
                goto out;
            }

            /*
             * If we ever do support any options, this will be where
             * we insert code to recognise and validate them.
             *
             * At present, we implement no critical options at all.
             * (For host certs, as of 2022-04-20, OpenSSH hasn't
             * defined any. For user certs, the only SSH server using
             * this is Uppity, which doesn't support key restrictions
             * in general.)
             */
            (void)data; /* no options supported => no use made of the data */

            /*
             * Report an unrecognised literal.
             */
            put_fmt(error, "Certificate specifies an unsupported critical "
                    "option \"");
            put_c_string_literal(error, option);
            put_fmt(error, "\"");
            goto out;
        }
    }

    /* If we get here without failing any check, accept the certificate! */
    result = true;

  out:
    if (ca_key)
        ssh_key_free(ca_key);
    strbuf_free(preimage);
    return result;
}